

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  cpp_dec_float<100U,_int,_void> *v;
  cpp_dec_float<100U,_int,_void> *pcVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int *piVar14;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_228;
  int local_1d4;
  uint local_1d0;
  int local_1cc;
  cpp_dec_float<100U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 local_168 [24];
  uint auStack_150 [2];
  undefined1 local_148 [16];
  uint local_138 [2];
  uint uStack_130;
  undefined3 uStack_12b;
  int iStack_128;
  bool bStack_124;
  fpclass_type local_120;
  int32_t iStack_11c;
  int *local_118;
  pointer local_110;
  int *local_108;
  int *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  long local_f0;
  int *local_e8;
  long local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 0x10;
  local_1c8.data._M_elems[0] = 0;
  local_1c8.data._M_elems[1] = 0;
  local_1c8.data._M_elems[2] = 0;
  local_1c8.data._M_elems[3] = 0;
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems[6] = 0;
  local_1c8.data._M_elems[7] = 0;
  local_1c8.data._M_elems[8] = 0;
  local_1c8.data._M_elems[9] = 0;
  local_1c8.data._M_elems[10] = 0;
  local_1c8.data._M_elems[0xb] = 0;
  local_1c8.data._M_elems[0xc] = 0;
  local_1c8.data._M_elems[0xd] = 0;
  local_1c8.data._M_elems._56_5_ = 0;
  local_1c8.data._M_elems[0xf]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  local_1d4 = (this->l).firstUnused;
  iVar7 = (this->l).firstUpdate;
  lVar12 = (long)iVar7;
  if (iVar7 < local_1d4) {
    local_110 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_118 = (this->l).idx;
    local_100 = (this->l).row;
    local_108 = (this->l).start;
    local_170 = vec;
    local_f8 = eps;
    local_e8 = ridx;
    do {
      iVar7 = local_100[lVar12];
      local_168._0_16_ = *(undefined1 (*) [16])vec[iVar7].m_backend.data._M_elems;
      unique0x10000b08 = *(undefined1 (*) [16])(vec[iVar7].m_backend.data._M_elems + 4);
      local_148 = *(undefined1 (*) [16])(vec[iVar7].m_backend.data._M_elems + 8);
      puVar1 = vec[iVar7].m_backend.data._M_elems + 0xc;
      local_138 = *(uint (*) [2])puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      _uStack_130 = (undefined5)uVar3;
      uStack_12b = (undefined3)((ulong)uVar3 >> 0x28);
      local_228.exp = vec[iVar7].m_backend.exp;
      bStack_124 = vec[iVar7].m_backend.neg;
      local_120 = vec[iVar7].m_backend.fpclass;
      iStack_11c = vec[iVar7].m_backend.prec_elem;
      local_228.data._M_elems._0_8_ = *(undefined8 *)vec[iVar7].m_backend.data._M_elems;
      local_228.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar7].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar7].m_backend.data._M_elems + 4;
      local_228.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_228.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar7].m_backend.data._M_elems + 8;
      local_228.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_228.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar7].m_backend.data._M_elems + 0xc;
      local_228.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_228.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_228.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(local_f8->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 6);
      local_88.data._M_elems._32_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 8);
      local_88.data._M_elems._40_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 10);
      local_88.data._M_elems._48_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 0xc);
      local_88.data._M_elems._56_8_ = *(undefined8 *)((local_f8->m_backend).data._M_elems + 0xe);
      local_88.exp = (local_f8->m_backend).exp;
      local_88.neg = (local_f8->m_backend).neg;
      local_88.fpclass = (local_f8->m_backend).fpclass;
      local_88.prec_elem = (local_f8->m_backend).prec_elem;
      local_228.prec_elem = iStack_11c;
      local_228.fpclass = local_120;
      local_228.neg = bStack_124;
      if ((bStack_124 == true) &&
         (local_228.data._M_elems[0] != 0 || local_120 != cpp_dec_float_finite)) {
        local_228.neg = false;
      }
      local_f0 = lVar12;
      if ((local_88.fpclass != cpp_dec_float_NaN && local_120 != cpp_dec_float_NaN) &&
         (iStack_128 = local_228.exp,
         iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_228,&local_88), 0 < iVar7)) {
        lVar10 = (long)local_108[lVar12];
        iVar7 = local_108[lVar12 + 1];
        if (local_108[lVar12] < iVar7) {
          pcVar11 = &local_110[lVar10].m_backend;
          piVar14 = local_118 + lVar10;
          local_e0 = lVar10;
          do {
            iVar2 = *piVar14;
            local_e8[n] = iVar2;
            local_1c8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
            local_1c8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
            local_1c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_1c8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 8;
            local_1c8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_1c8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 0xc;
            local_1c8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar3 = *(undefined8 *)(puVar1 + 2);
            local_1c8.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_1c8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1c8.exp = vec[iVar2].m_backend.exp;
            local_1c8.neg = vec[iVar2].m_backend.neg;
            local_1c8.fpclass = vec[iVar2].m_backend.fpclass;
            local_1c8.prec_elem = vec[iVar2].m_backend.prec_elem;
            uVar9 = 0;
            local_1cc = n;
            if (local_1c8.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_228,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1c8,&local_228);
              uVar9 = (uint)(iVar8 == 0);
            }
            auVar6 = local_148;
            auVar5 = stack0xfffffffffffffea8;
            auVar4 = local_168._0_16_;
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            v = (cpp_dec_float<100U,_int,_void> *)local_168;
            if (pcVar11 != &local_d8) {
              local_d8.data._M_elems[0xc] = local_138[0];
              local_d8.data._M_elems[0xd] = local_138[1];
              local_d8.data._M_elems._56_5_ = _uStack_130;
              local_d8.data._M_elems[0xf]._1_3_ = uStack_12b;
              local_d8.data._M_elems[8] = local_148._0_4_;
              local_d8.data._M_elems[9] = local_148._4_4_;
              local_d8.data._M_elems[10] = local_148._8_4_;
              local_d8.data._M_elems[0xb] = local_148._12_4_;
              local_d8.data._M_elems[4] = local_168._16_4_;
              local_d8.data._M_elems[5] = local_168._20_4_;
              local_d8.data._M_elems[6] = auStack_150[0];
              local_d8.data._M_elems[7] = auStack_150[1];
              local_d8.data._M_elems[0] = local_168._0_4_;
              local_d8.data._M_elems[1] = local_168._4_4_;
              local_d8.data._M_elems[2] = local_168._8_4_;
              local_d8.data._M_elems[3] = local_168._12_4_;
              local_d8.exp = iStack_128;
              local_d8.neg = bStack_124;
              local_d8.fpclass = local_120;
              local_d8.prec_elem = iStack_11c;
              v = pcVar11;
            }
            local_1d0 = uVar9;
            local_168._0_16_ = auVar4;
            unique0x10001626 = auVar5;
            local_148 = auVar6;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_d8,v)
            ;
            local_228.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
            local_228.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
            local_228.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
            local_228.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
            local_228.data._M_elems[8] = local_1c8.data._M_elems[8];
            local_228.data._M_elems[9] = local_1c8.data._M_elems[9];
            local_228.data._M_elems[10] = local_1c8.data._M_elems[10];
            local_228.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
            local_228.data._M_elems[4] = local_1c8.data._M_elems[4];
            local_228.data._M_elems[5] = local_1c8.data._M_elems[5];
            local_228.data._M_elems[6] = local_1c8.data._M_elems[6];
            local_228.data._M_elems[7] = local_1c8.data._M_elems[7];
            local_228.data._M_elems[0] = local_1c8.data._M_elems[0];
            local_228.data._M_elems[1] = local_1c8.data._M_elems[1];
            local_228.data._M_elems[2] = local_1c8.data._M_elems[2];
            local_228.data._M_elems[3] = local_1c8.data._M_elems[3];
            local_228.exp = local_1c8.exp;
            local_228.neg = local_1c8.neg;
            local_228.fpclass = local_1c8.fpclass;
            local_228.prec_elem = local_1c8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_228,&local_d8);
            local_1c8.data._M_elems[0] = local_228.data._M_elems[0];
            local_1c8.data._M_elems[1] = local_228.data._M_elems[1];
            uVar3 = local_1c8.data._M_elems._0_8_;
            local_1c8.data._M_elems[0] = local_228.data._M_elems[0];
            local_1c8.data._M_elems[1] = local_228.data._M_elems[1];
            local_1c8.data._M_elems[2] = local_228.data._M_elems[2];
            local_1c8.data._M_elems[3] = local_228.data._M_elems[3];
            local_1c8.data._M_elems[4] = local_228.data._M_elems[4];
            local_1c8.data._M_elems[5] = local_228.data._M_elems[5];
            local_1c8.data._M_elems[6] = local_228.data._M_elems[6];
            local_1c8.data._M_elems[7] = local_228.data._M_elems[7];
            local_1c8.data._M_elems[8] = local_228.data._M_elems[8];
            local_1c8.data._M_elems[9] = local_228.data._M_elems[9];
            local_1c8.data._M_elems[10] = local_228.data._M_elems[10];
            local_1c8.data._M_elems[0xb] = local_228.data._M_elems[0xb];
            local_1c8.data._M_elems[0xc] = local_228.data._M_elems[0xc];
            local_1c8.data._M_elems[0xd] = local_228.data._M_elems[0xd];
            local_1c8.data._M_elems._56_5_ = local_228.data._M_elems._56_5_;
            local_1c8.data._M_elems[0xf]._1_3_ = local_228.data._M_elems[0xf]._1_3_;
            local_1c8.exp = local_228.exp;
            local_1c8.neg = local_228.neg;
            local_1c8.fpclass = local_228.fpclass;
            local_1c8.prec_elem = local_228.prec_elem;
            if (local_228.fpclass == cpp_dec_float_NaN) {
LAB_003f25e6:
              local_1c8.data._M_elems._0_8_ = uVar3;
              local_228.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
              local_228.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
              local_228.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
              local_228.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
              local_228.data._M_elems[8] = local_1c8.data._M_elems[8];
              local_228.data._M_elems[9] = local_1c8.data._M_elems[9];
              local_228.data._M_elems[10] = local_1c8.data._M_elems[10];
              local_228.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
              local_228.data._M_elems[4] = local_1c8.data._M_elems[4];
              local_228.data._M_elems[5] = local_1c8.data._M_elems[5];
              local_228.data._M_elems[6] = local_1c8.data._M_elems[6];
              local_228.data._M_elems[7] = local_1c8.data._M_elems[7];
              local_228.data._M_elems[0] = local_1c8.data._M_elems[0];
              local_228.data._M_elems[1] = local_1c8.data._M_elems[1];
              local_228.data._M_elems[2] = local_1c8.data._M_elems[2];
              local_228.data._M_elems[3] = local_1c8.data._M_elems[3];
              local_228.exp = local_1c8.exp;
              local_228.neg = local_1c8.neg;
              local_228.fpclass = local_1c8.fpclass;
              local_228.prec_elem = local_1c8.prec_elem;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_228,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1c8,&local_228);
              uVar3 = local_1c8.data._M_elems._0_8_;
              if (iVar8 != 0) goto LAB_003f25e6;
              local_228.fpclass = cpp_dec_float_finite;
              local_228.prec_elem = 0x10;
              local_228.data._M_elems[0] = 0;
              local_228.data._M_elems[1] = 0;
              local_228.data._M_elems[2] = 0;
              local_228.data._M_elems[3] = 0;
              local_228.data._M_elems[4] = 0;
              local_228.data._M_elems[5] = 0;
              local_228.data._M_elems[6] = 0;
              local_228.data._M_elems[7] = 0;
              local_228.data._M_elems[8] = 0;
              local_228.data._M_elems[9] = 0;
              local_228.data._M_elems[10] = 0;
              local_228.data._M_elems[0xb] = 0;
              local_228.data._M_elems[0xc] = 0;
              local_228.data._M_elems[0xd] = 0;
              local_228.data._M_elems._56_5_ = 0;
              local_228.data._M_elems[0xf]._1_3_ = 0;
              local_228.exp = 0;
              local_228.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_228,1e-100);
            }
            piVar14 = piVar14 + 1;
            pnVar13 = local_170 + iVar2;
            n = local_1cc + local_1d0;
            pcVar11 = pcVar11 + 1;
            *(undefined8 *)((pnVar13->m_backend).data._M_elems + 0xc) =
                 local_228.data._M_elems._48_8_;
            *(ulong *)((pnVar13->m_backend).data._M_elems + 0xe) =
                 CONCAT35(local_228.data._M_elems[0xf]._1_3_,local_228.data._M_elems._56_5_);
            *(undefined8 *)((pnVar13->m_backend).data._M_elems + 8) = local_228.data._M_elems._32_8_
            ;
            *(undefined8 *)((pnVar13->m_backend).data._M_elems + 10) =
                 local_228.data._M_elems._40_8_;
            *(undefined8 *)((pnVar13->m_backend).data._M_elems + 4) = local_228.data._M_elems._16_8_
            ;
            *(undefined8 *)((pnVar13->m_backend).data._M_elems + 6) = local_228.data._M_elems._24_8_
            ;
            *(undefined8 *)(pnVar13->m_backend).data._M_elems = local_228.data._M_elems._0_8_;
            *(undefined8 *)((pnVar13->m_backend).data._M_elems + 2) = local_228.data._M_elems._8_8_;
            (pnVar13->m_backend).exp = local_228.exp;
            (pnVar13->m_backend).neg = local_228.neg;
            (pnVar13->m_backend).fpclass = local_228.fpclass;
            (pnVar13->m_backend).prec_elem = local_228.prec_elem;
            iVar7 = iVar7 + -1;
            vec = local_170;
          } while ((int)local_e0 < iVar7);
        }
      }
      lVar12 = local_f0 + 1;
    } while (local_1d4 != (int)lVar12);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}